

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

QString * __thiscall
QFileSystemModelPrivate::size
          (QString *__return_storage_ptr__,QFileSystemModelPrivate *this,QModelIndex *index)

{
  Data *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Type TVar5;
  qint64 bytes;
  QFileSystemNode *pQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QByteArrayView QVar8;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((index->r < 0) || (index->c < 0)) || ((index->m).ptr == (QAbstractItemModel *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_00620f3b;
  }
  if ((index->m).ptr == (QAbstractItemModel *)0x0) {
    pQVar6 = &this->root;
  }
  else {
    pQVar6 = (QFileSystemNode *)index->i;
  }
  if (pQVar6->info == (QExtendedInformation *)0x0) {
    pDVar1 = (pQVar6->children).d;
    if (pDVar1 != (Data *)0x0) {
      bVar7 = 0 < (long)pDVar1->size;
      goto LAB_00620eae;
    }
  }
  else {
    TVar5 = QExtendedInformation::type(pQVar6->info);
    bVar7 = TVar5 == Dir;
LAB_00620eae:
    if (bVar7) {
      QVar8.m_data = (storage_type *)0x0;
      QVar8.m_size = (qsizetype)&local_38;
      QString::fromLatin1(QVar8);
      qVar4 = local_28;
      pcVar3 = pcStack_30;
      pDVar2 = local_38;
      local_38 = (Data *)0x0;
      pcStack_30 = (char16_t *)0x0;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = pcVar3;
      local_28 = 0;
      (__return_storage_ptr__->d).size = qVar4;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return __return_storage_ptr__;
      }
      goto LAB_00620f3b;
    }
  }
  if ((pQVar6->info == (QExtendedInformation *)0x0) ||
     (TVar5 = QExtendedInformation::type(pQVar6->info), TVar5 == Dir)) {
    bytes = 0;
  }
  else {
    bytes = QExtendedInformation::size(pQVar6->info);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    size(__return_storage_ptr__,bytes);
    return __return_storage_ptr__;
  }
LAB_00620f3b:
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModelPrivate::size(const QModelIndex &index) const
{
    if (!index.isValid())
        return QString();
    const QFileSystemNode *n = node(index);
    if (n->isDir()) {
#ifdef Q_OS_MAC
        return "--"_L1;
#else
        return ""_L1;
#endif
    // Windows   - ""
    // OS X      - "--"
    // Konqueror - "4 KB"
    // Nautilus  - "9 items" (the number of children)
    }
    return size(n->size());
}